

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

string_view __thiscall stream_buffer::next_token(stream_buffer *this)

{
  istream *piVar1;
  size_t sVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  basic_istream<char,_std::char_traits<char>_> *pbVar8;
  long lVar9;
  size_t start;
  bool starts_with_number;
  stream_buffer *this_local;
  
  pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                     (&this->token,(long)this->current_token_buffer);
  pvVar7 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                     (&this->token,(long)this->current_token_buffer);
  if (pvVar6->buffer[pvVar7->current] == '\0') {
    this->current_token_buffer =
         this->current_token_buffer + 1 + ((this->current_token_buffer + 1) / 10) * -10;
    bVar3 = std::ios::good();
    if ((bVar3 & 1) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      return _this_local;
    }
    pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                       (&this->token,(long)this->current_token_buffer);
    pvVar6->buffer[0] = '\0';
    do {
      while( true ) {
        pbVar8 = this->is;
        pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                           (&this->token,(long)this->current_token_buffer);
        pbVar8 = std::operator>>(pbVar8,pvVar6->buffer);
        bVar4 = std::ios::operator_cast_to_bool
                          ((ios *)(pbVar8 + *(long *)(*(long *)pbVar8 + -0x18)));
        if (!bVar4) goto LAB_0014b4a3;
        pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                           (&this->token,(long)this->current_token_buffer);
        if (pvVar6->buffer[0] != '\\') break;
        piVar1 = this->is;
        lVar9 = std::numeric_limits<long>::max();
        std::istream::ignore((long)piVar1,(int)lVar9);
      }
      pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                         (&this->token,(long)this->current_token_buffer);
    } while (pvVar6->buffer[0] == '\0');
LAB_0014b4a3:
    pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                       (&this->token,(long)this->current_token_buffer);
    pvVar6->current = 0;
    pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                       (&this->token,(long)this->current_token_buffer);
    if (pvVar6->buffer[0] == '\0') {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      return _this_local;
    }
  }
  pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                     (&this->token,(long)this->current_token_buffer);
  pvVar7 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                     (&this->token,(long)this->current_token_buffer);
  if (pvVar6->buffer[pvVar7->current] == '\0') {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  }
  else {
    pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                       (&this->token,(long)this->current_token_buffer);
    pvVar7 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                       (&this->token,(long)this->current_token_buffer);
    bVar4 = starts_with_a_number((int)pvVar6->buffer[pvVar7->current]);
    pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                       (&this->token,(long)this->current_token_buffer);
    sVar2 = pvVar6->current;
    pvVar6->current = sVar2 + 1;
    pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                       (&this->token,(long)this->current_token_buffer);
    bVar5 = is_separator((int)pvVar6->buffer[sVar2]);
    if (bVar5) {
      pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                         (&this->token,(long)this->current_token_buffer);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 pvVar6->buffer + sVar2,1);
    }
    else {
      pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                         (&this->token,(long)this->current_token_buffer);
      pvVar7 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                         (&this->token,(long)this->current_token_buffer);
      if (pvVar6->buffer[pvVar7->current] == '\0') {
        pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                           (&this->token,(long)this->current_token_buffer);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                   pvVar6->buffer + sVar2,1);
      }
      else {
        while( true ) {
          pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                             (&this->token,(long)this->current_token_buffer);
          pvVar7 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                             (&this->token,(long)this->current_token_buffer);
          if (pvVar6->buffer[pvVar7->current] == '\0') break;
          pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                             (&this->token,(long)this->current_token_buffer);
          pvVar7 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                             (&this->token,(long)this->current_token_buffer);
          bVar5 = is_separator((int)pvVar6->buffer[pvVar7->current]);
          if (bVar5) break;
          if (bVar4) {
            pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                               (&this->token,(long)this->current_token_buffer);
            pvVar7 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                               (&this->token,(long)this->current_token_buffer);
            bVar5 = is_number((int)pvVar6->buffer[pvVar7->current]);
            if (!bVar5) break;
          }
          pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                             (&this->token,(long)this->current_token_buffer);
          pvVar6->current = pvVar6->current + 1;
        }
        pvVar6 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                           (&this->token,(long)this->current_token_buffer);
        pvVar7 = std::array<stream_buffer::stream_token,_10UL>::operator[]
                           (&this->token,(long)this->current_token_buffer);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                   pvVar6->buffer + sVar2,pvVar7->current - sVar2);
      }
    }
  }
  return _this_local;
}

Assistant:

std::string_view next_token() noexcept
    {
        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0') {
            current_token_buffer =
              (current_token_buffer + 1) % stream_buffer_size;
            if (!is.good())
                return std::string_view();

            token[current_token_buffer].buffer[0] = '\0';
            while (is >> token[current_token_buffer].buffer) {
                if (token[current_token_buffer].buffer[0] == '\\') {
                    is.ignore(std::numeric_limits<std::streamsize>::max(),
                              '\n');
                    continue;
                }

                if (token[current_token_buffer].buffer[0] == '\0')
                    continue;

                break;
            }

            token[current_token_buffer].current = 0;
            if (token[current_token_buffer].buffer[0] == '\0')
                return std::string_view();
        }

        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0')
            return std::string_view();

        bool starts_with_number =
          starts_with_a_number(token[current_token_buffer]
                                 .buffer[token[current_token_buffer].current]);

        std::size_t start = token[current_token_buffer].current++;

        if (is_separator(token[current_token_buffer].buffer[start]))
            return std::string_view(&token[current_token_buffer].buffer[start],
                                    1);

        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0')
            return std::string_view(&token[current_token_buffer].buffer[start],
                                    1);

        while (token[current_token_buffer]
                 .buffer[token[current_token_buffer].current] != '\0') {
            if (is_separator(token[current_token_buffer]
                               .buffer[token[current_token_buffer].current]))
                break;

            if (starts_with_number &&
                !is_number(token[current_token_buffer]
                             .buffer[token[current_token_buffer].current]))
                break;

            ++token[current_token_buffer].current;
        }

        return std::string_view(&token[current_token_buffer].buffer[start],
                                token[current_token_buffer].current - start);
    }